

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Matrix4x4 * __thiscall
CMU462::DynamicScene::SceneObject::getTransformation
          (Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3D local_468;
  Vector3D local_448;
  Matrix4x4 local_428;
  Matrix4x4 local_3a8;
  Matrix4x4 local_328;
  Matrix4x4 local_2a8;
  Matrix4x4 local_228;
  Matrix4x4 local_1a8;
  Matrix4x4 local_128;
  Matrix4x4 local_a8;
  
  dVar1 = (this->rotation).x;
  dVar2 = (this->rotation).y;
  dVar3 = (this->rotation).z;
  local_448.x = (this->position).x;
  local_448.y = (this->position).y;
  local_448.z = (this->position).z;
  Matrix4x4::translation(&local_448);
  Matrix4x4::rotation(&local_2a8,dVar1 * 3.141592653589793 * 0.005555555555555556,X);
  Matrix4x4::operator*(&local_1a8,&local_228,&local_2a8);
  Matrix4x4::rotation(&local_328,dVar2 * 3.141592653589793 * 0.005555555555555556,Y);
  Matrix4x4::operator*(&local_128,&local_1a8,&local_328);
  Matrix4x4::rotation(&local_3a8,dVar3 * 3.141592653589793 * 0.005555555555555556,Z);
  Matrix4x4::operator*(&local_a8,&local_128,&local_3a8);
  local_468.x = (this->scale).x;
  local_468.y = (this->scale).y;
  local_468.z = (this->scale).z;
  Matrix4x4::scaling(&local_468);
  Matrix4x4::operator*(__return_storage_ptr__,&local_a8,&local_428);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 SceneObject::getTransformation() {
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::translation(position) *
         Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X) *
         Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y) *
         Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z) *
         Matrix4x4::scaling(scale);
}